

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  long lVar3;
  pointer pFVar4;
  pointer pTVar5;
  pointer pMVar6;
  pointer pGVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pEVar10;
  pointer pEVar11;
  pointer pDVar12;
  ElemSegment *pEVar13;
  ElemDesc *pEVar14;
  pointer pDVar15;
  DataDesc *pDVar16;
  pointer size;
  pointer pSVar17;
  uint64_t uVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  Result RVar22;
  Memory *pMVar23;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> _Var24;
  pointer puVar25;
  pointer pRVar26;
  ulong uVar27;
  long lVar28;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *__x;
  pointer pFVar29;
  pointer pTVar30;
  Ref RVar31;
  undefined8 uVar32;
  pointer pSVar33;
  TableDesc *desc;
  pointer pTVar34;
  pointer pMVar35;
  pointer pGVar36;
  iterator iVar37;
  Store *store_00;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  Instance *pIVar38;
  ulong uVar39;
  ElemDesc *desc_4;
  long lVar40;
  pointer pEVar41;
  ElemSegment *src;
  pointer src_00;
  ExportDesc *desc_3;
  pointer pEVar42;
  pointer pDVar43;
  Ref extern_ref;
  Value value;
  Ref ref;
  Value value_1;
  anon_union_16_6_113bff37_for_Value_0 local_3f8;
  Index local_3e8;
  Ptr *local_3e0;
  RefPtr<wabt::interp::Instance> local_3d8;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_3b8;
  anon_union_16_6_113bff37_for_Value_0 local_398;
  Index local_388;
  Ptr *local_380;
  undefined1 local_378 [136];
  RefPtr<wabt::interp::Module> local_2f0;
  anon_union_16_6_113bff37_for_Value_0 local_2d8;
  long local_2c8;
  RefVec *local_2c0;
  TagType local_2b8;
  GlobalType local_290;
  FuncDesc local_278;
  FuncDesc local_200;
  FuncDesc local_188;
  FuncDesc local_110;
  Ref local_98;
  MemoryType local_90;
  TableType local_60;
  
  local_3e0 = __return_storage_ptr__;
  local_98.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_2f0,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_3d8,store,store,&local_98);
  pIVar1 = ((local_2f0.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = *(pointer *)
            ((long)&((local_2f0.obj_)->desc_).imports.
                    super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
            + 8);
  uVar39 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_2c0 = imports;
  if (uVar39 <= (ulong)((long)(imports->
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(imports->
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_380 = out_trap;
    if (pIVar2 != pIVar1) {
      local_2c8 = uVar39 + (uVar39 == 0);
      lVar28 = 0;
      lVar40 = 0;
      do {
        lVar3 = *(long *)&((local_2f0.obj_)->desc_).imports.
                          super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                          ._M_impl.super__Vector_impl_data;
        local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_2c0->
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar40].index;
        if (local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     "invalid import \"%s.%s\"",*(undefined8 *)(lVar3 + lVar28),
                     *(undefined8 *)(lVar3 + 0x20 + lVar28));
          local_388 = 0;
          local_398.i64_ = 0;
          local_398._8_8_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_3f8.v128_,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                     &local_398.v128_);
          local_380->obj_ = (Trap *)local_3f8.i64_;
          local_380->store_ = (Store *)local_3f8._8_8_;
          local_380->root_index_ = local_3e8;
          local_3e8 = 0;
          local_3f8.i64_ = 0;
          local_3f8._8_8_ = (Store *)0x0;
          if ((Memory *)local_398.i64_ != (Memory *)0x0) {
            operator_delete((void *)local_398.i64_,local_388 - local_398._0_8_);
          }
          goto LAB_001b10aa;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)local_378,store,
                   (Ref)local_3b8.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar21 = (**(code **)(*(long *)local_378._0_8_ + 0x18))
                           (local_378._0_8_,store,lVar28 + lVar3,local_380);
        if (iVar21 == 1) {
          local_3e0->obj_ = (Instance *)0x0;
          local_3e0->store_ = (Store *)0x0;
          local_3e0->root_index_ = 0;
        }
        else {
          iVar37._M_current =
               ((local_3d8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar37._M_current ==
              ((local_3d8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_3d8.obj_)->imports_,iVar37,(Ref *)&local_3b8);
          }
          else {
            (iVar37._M_current)->index =
                 (size_t)local_3b8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3d8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar37._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)(lVar3 + 0x40 + lVar28) + 8)) {
          case 0:
            iVar37._M_current =
                 ((local_3d8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar37._M_current ==
                ((local_3d8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->funcs_;
LAB_001b130b:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar37,(Ref *)&local_3b8);
            }
            else {
              (iVar37._M_current)->index =
                   (size_t)local_3b8.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_3d8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar37._M_current + 1;
            }
            break;
          case 1:
            iVar37._M_current =
                 ((local_3d8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar37._M_current ==
                ((local_3d8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->tables_;
              goto LAB_001b130b;
            }
            (iVar37._M_current)->index =
                 (size_t)local_3b8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3d8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar37._M_current + 1;
            break;
          case 2:
            iVar37._M_current =
                 ((local_3d8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar37._M_current ==
                ((local_3d8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->memories_;
              goto LAB_001b130b;
            }
            (iVar37._M_current)->index =
                 (size_t)local_3b8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3d8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar37._M_current + 1;
            break;
          case 3:
            iVar37._M_current =
                 ((local_3d8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar37._M_current ==
                ((local_3d8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->globals_;
              goto LAB_001b130b;
            }
            (iVar37._M_current)->index =
                 (size_t)local_3b8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3d8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar37._M_current + 1;
            break;
          case 4:
            iVar37._M_current =
                 ((local_3d8.obj_)->tags_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar37._M_current ==
                ((local_3d8.obj_)->tags_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->tags_;
              goto LAB_001b130b;
            }
            (iVar37._M_current)->index =
                 (size_t)local_3b8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_3d8.obj_)->tags_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar37._M_current + 1;
          }
        }
        if ((long *)local_378._0_8_ != (long *)0x0) {
          Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
        }
        if (iVar21 == 1) goto LAB_001b10d2;
        lVar40 = lVar40 + 1;
        lVar28 = lVar28 + 0x48;
      } while (local_2c8 != lVar40);
    }
    pFVar29 = ((local_2f0.obj_)->desc_).funcs.
              super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar4 = *(pointer *)
              ((long)&((local_2f0.obj_)->desc_).funcs.
                      super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
              + 8);
    if (pFVar29 != pFVar4) {
      __x = &pFVar29->handlers;
      do {
        pIVar38 = local_3d8.obj_;
        if (local_3d8.store_ == (Store *)0x0) {
          pMVar23 = (Memory *)0x0;
        }
        else {
          pMVar23 = (Memory *)
                    ((local_3d8.store_)->roots_).list_.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_3d8.root_index_].index;
          if ((long)pMVar23 < 0) goto LAB_001b25c9;
        }
        local_110.type.super_ExternType.kind =
             *(ExternKind *)
              &(((_Vector_impl *)&(((FuncDesc *)(__x + -4))->type).super_ExternType)->
               super__Vector_impl_data)._M_finish;
        local_110.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_110.type.params,&(((FuncDesc *)(__x + -4))->type).params);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_110.type.results,
                   (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)(__x + -3) + 0x10));
        std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                  (&local_110.locals,
                   (vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)
                   ((long)(__x + -2) + 0x10));
        local_110.code_offset = *(u32 *)((long)(__x + -1) + 0x10);
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                  (&local_110.handlers,__x);
        local_3f8._0_8_ = pMVar23;
        Store::
        Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                  ((RefPtr<wabt::interp::DefinedFunc> *)local_378,store,store,&local_3f8.ref_,
                   &local_110);
        if ((Store *)local_378._8_8_ == (Store *)0x0) {
          pMVar23 = (Memory *)0x0;
        }
        else {
          pMVar23 = (Memory *)
                    (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
          if ((long)pMVar23 < 0) goto LAB_001b25c9;
        }
        iVar37._M_current =
             (pIVar38->funcs_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_3f8.i64_ = (u64)pMVar23;
        if (iVar37._M_current ==
            (pIVar38->funcs_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar38->funcs_,iVar37,&local_3f8.ref_);
        }
        else {
          (iVar37._M_current)->index = (size_t)pMVar23;
          (pIVar38->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar37._M_current + 1;
        }
        if ((long *)local_378._0_8_ != (long *)0x0) {
          Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
          local_378._0_8_ = (long *)0x0;
          local_378._8_8_ = (Store *)0x0;
          local_378._16_8_ = 0;
        }
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                  (&local_110.handlers);
        if (local_110.locals.
            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.locals.
                          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_110.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.locals.
                                super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_110.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
        if (local_110.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.type.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.type.results.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_110.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.type.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_110.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.type.params.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pFVar29 = (pointer)(__x + 1);
        __x = __x + 5;
      } while (pFVar29 != pFVar4);
    }
    pTVar34 = ((local_2f0.obj_)->desc_).tables.
              super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar5 = *(pointer *)
              ((long)&((local_2f0.obj_)->desc_).tables.
                      super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
              + 8);
    if (pTVar34 != pTVar5) {
      do {
        pIVar38 = local_3d8.obj_;
        local_60.super_ExternType.kind = (pTVar34->type).super_ExternType.kind;
        local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00246170;
        local_60._12_8_ = *(undefined8 *)&(pTVar34->type).super_ExternType.field_0xc;
        uVar32 = *(undefined8 *)&(pTVar34->type).field_0x14;
        local_60.limits._11_8_ = *(undefined8 *)((long)&(pTVar34->type).limits.max + 3);
        local_60.limits._4_7_ =
             SUB87((ulong)*(undefined8 *)((long)&(pTVar34->type).limits.initial + 3) >> 8,0);
        local_60._20_7_ = SUB87(uVar32,0);
        local_60.limits.initial._3_1_ = (undefined1)((ulong)uVar32 >> 0x38);
        Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                  ((RefPtr<wabt::interp::Table> *)local_378,store,store,&local_60);
        if ((Store *)local_378._8_8_ == (Store *)0x0) {
          pMVar23 = (Memory *)0x0;
        }
        else {
          pMVar23 = (Memory *)
                    (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
          if ((long)pMVar23 < 0) goto LAB_001b25c9;
        }
        iVar37._M_current =
             (pIVar38->tables_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_3f8.i64_ = (u64)pMVar23;
        if (iVar37._M_current ==
            (pIVar38->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar38->tables_,iVar37,&local_3f8.ref_);
        }
        else {
          (iVar37._M_current)->index = (size_t)pMVar23;
          (pIVar38->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar37._M_current + 1;
        }
        if ((long *)local_378._0_8_ != (long *)0x0) {
          Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
        }
        pTVar34 = pTVar34 + 1;
      } while (pTVar34 != pTVar5);
    }
    pMVar35 = ((local_2f0.obj_)->desc_).memories.
              super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar6 = *(pointer *)
              ((long)&((local_2f0.obj_)->desc_).memories.
                      super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
              + 8);
    if (pMVar35 != pMVar6) {
      do {
        pIVar38 = local_3d8.obj_;
        local_90.super_ExternType.kind = (pMVar35->type).super_ExternType.kind;
        local_90.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002461b0;
        local_90.limits.initial = (pMVar35->type).limits.initial;
        uVar18 = (pMVar35->type).limits.max;
        local_90._36_8_ = *(undefined8 *)&(pMVar35->type).limits.field_0x14;
        local_90.limits._16_4_ =
             SUB84((ulong)*(undefined8 *)((long)&(pMVar35->type).limits.max + 4) >> 0x20,0);
        local_90.limits.max._0_4_ = (undefined4)uVar18;
        local_90.limits.max._4_4_ = (undefined4)(uVar18 >> 0x20);
        Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                  ((RefPtr<wabt::interp::Memory> *)local_378,store,store,&local_90);
        if ((Store *)local_378._8_8_ == (Store *)0x0) {
          pMVar23 = (Memory *)0x0;
        }
        else {
          pMVar23 = (Memory *)
                    (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
          if ((long)pMVar23 < 0) goto LAB_001b25c9;
        }
        iVar37._M_current =
             (pIVar38->memories_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_3f8.i64_ = (u64)pMVar23;
        if (iVar37._M_current ==
            (pIVar38->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar38->memories_,iVar37,&local_3f8.ref_);
        }
        else {
          (iVar37._M_current)->index = (size_t)pMVar23;
          (pIVar38->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar37._M_current + 1;
        }
        if ((long *)local_378._0_8_ != (long *)0x0) {
          Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
        }
        pMVar35 = pMVar35 + 1;
      } while (pMVar35 != pMVar6);
    }
    pGVar7 = *(pointer *)
              ((long)&((local_2f0.obj_)->desc_).globals.
                      super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              + 8);
    for (pGVar36 = ((local_2f0.obj_)->desc_).globals.
                   super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pGVar36 != pGVar7;
        pGVar36 = pGVar36 + 1) {
      local_398.i64_ = 0;
      local_398._8_8_ = (Store *)0x0;
      if (local_3d8.store_ == (Store *)0x0) {
        pMVar23 = (Memory *)0x0;
      }
      else {
        pMVar23 = (Memory *)
                  ((local_3d8.store_)->roots_).list_.
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[local_3d8.root_index_].index;
        if ((long)pMVar23 < 0) goto LAB_001b25c9;
      }
      local_188.type.super_ExternType.kind =
           *(ExternKind *)((long)&(pGVar36->init_func).type.super_ExternType + 8);
      local_188.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_188.type.params,&(pGVar36->init_func).type.params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_188.type.results,&(pGVar36->init_func).type.results);
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                (&local_188.locals,&(pGVar36->init_func).locals);
      local_188.code_offset = (pGVar36->init_func).code_offset;
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                (&local_188.handlers,&(pGVar36->init_func).handlers);
      local_3f8._0_8_ = pMVar23;
      Store::
      Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                ((RefPtr<wabt::interp::DefinedFunc> *)local_378,store,store,&local_3f8.ref_,
                 &local_188);
      if ((Store *)local_378._8_8_ == (Store *)0x0) {
        RVar31.index = 0;
      }
      else {
        RVar31.index = (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                       super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
        if ((long)RVar31.index < 0) goto LAB_001b25c9;
      }
      if ((long *)local_378._0_8_ != (long *)0x0) {
        Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
        local_378._0_8_ = (long *)0x0;
        local_378._8_8_ = (Store *)0x0;
        local_378._16_8_ = 0;
      }
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
                (&local_188.handlers);
      if (local_188.locals.
          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.locals.
                        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.locals.
                              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_188.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
      if (local_188.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.type.results.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.type.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pIVar38 = (Instance *)
                local_188.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((Instance *)
          local_188.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (Instance *)0x0) {
        operator_delete(local_188.type.params.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      RVar22 = CallInitFunc(pIVar38,store,RVar31,(Value *)&local_398.v128_,local_380);
      pIVar38 = local_3d8.obj_;
      if (RVar22.enum_ == Error) goto LAB_001b10bf;
      local_290.super_ExternType.kind = (pGVar36->type).super_ExternType.kind;
      local_290.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002461f0;
      local_290.mut = (pGVar36->type).mut;
      local_290._12_8_ = *(undefined8 *)&(pGVar36->type).super_ExternType.field_0xc;
      local_3f8.i64_ = local_398.i64_;
      local_3f8._8_8_ = local_398._8_8_;
      Store::
      Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                ((RefPtr<wabt::interp::Global> *)local_378,store,store,&local_290,
                 (Value *)&local_3f8.v128_);
      if ((Store *)local_378._8_8_ == (Store *)0x0) {
        pMVar23 = (Memory *)0x0;
      }
      else {
        pMVar23 = (Memory *)
                  (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[local_378._16_8_].index;
        if ((long)pMVar23 < 0) goto LAB_001b25c9;
      }
      iVar37._M_current =
           (pIVar38->globals_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3f8.i64_ = (u64)pMVar23;
      if (iVar37._M_current ==
          (pIVar38->globals_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar38->globals_,iVar37,&local_3f8.ref_);
      }
      else {
        (iVar37._M_current)->index = (size_t)pMVar23;
        (pIVar38->globals_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar37._M_current + 1;
      }
      if ((long *)local_378._0_8_ != (long *)0x0) {
        Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
      }
    }
    pTVar8 = ((local_2f0.obj_)->desc_).tags.
             super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar9 = *(pointer *)
              ((long)&((local_2f0.obj_)->desc_).tags.
                      super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>
              + 8);
    if (pTVar8 != pTVar9) {
      do {
        pIVar38 = local_3d8.obj_;
        local_2b8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__TagType_00246230;
        local_2b8.super_ExternType.kind = (pTVar8->type).super_ExternType.kind;
        local_2b8.super_ExternType._12_4_ =
             *(undefined4 *)&(pTVar8->type).super_ExternType.field_0xc;
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                  (&local_2b8.signature,&(pTVar8->type).signature);
        Store::Alloc<wabt::interp::Tag,wabt::interp::Store&,wabt::interp::TagType&>
                  ((RefPtr<wabt::interp::Tag> *)local_378,store,store,&local_2b8);
        if ((Store *)local_378._8_8_ == (Store *)0x0) {
          pMVar23 = (Memory *)0x0;
        }
        else {
          pMVar23 = (Memory *)
                    (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
          if ((long)pMVar23 < 0) {
LAB_001b25c9:
            __assert_fail("IsUsed(index)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                          ,0xe6,
                          "T &wabt::interp::FreeList<wabt::interp::Ref>::Get(Index) [T = wabt::interp::Ref]"
                         );
          }
        }
        iVar37._M_current =
             (pIVar38->tags_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_3f8.i64_ = (u64)pMVar23;
        if (iVar37._M_current ==
            (pIVar38->tags_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar38->tags_,iVar37,&local_3f8.ref_);
        }
        else {
          (iVar37._M_current)->index = (size_t)pMVar23;
          (pIVar38->tags_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar37._M_current + 1;
        }
        if ((long *)local_378._0_8_ != (long *)0x0) {
          Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
          local_378._0_8_ = (long *)0x0;
          local_378._8_8_ = (Store *)0x0;
          local_378._16_8_ = 0;
        }
        local_2b8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__TagType_00246230;
        if (local_2b8.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2b8.signature.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2b8.signature.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2b8.signature.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pTVar30 = pTVar8 + 1;
        pTVar8 = pTVar8 + 1;
      } while (pTVar30 != pTVar9);
    }
    pEVar42 = ((local_2f0.obj_)->desc_).exports.
              super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar10 = *(pointer *)
               ((long)&((local_2f0.obj_)->desc_).exports.
                       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
               + 8);
    if (pEVar42 != pEVar10) {
      do {
        _Var24._M_head_impl =
             *(ExternType **)
              &(pEVar42->type).type._M_t.
               super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               ._M_t;
        switch(*(undefined4 *)((long)_Var24._M_head_impl + 8)) {
        case 0:
          uVar39 = (ulong)pEVar42->index;
          pRVar26 = ((local_3d8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 1:
          uVar39 = (ulong)pEVar42->index;
          pRVar26 = ((local_3d8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 2:
          uVar39 = (ulong)pEVar42->index;
          pRVar26 = ((local_3d8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 3:
          uVar39 = (ulong)pEVar42->index;
          pRVar26 = ((local_3d8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 4:
          uVar39 = (ulong)pEVar42->index;
          pRVar26 = ((local_3d8.obj_)->tags_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_001b1b6a_default;
        }
        _Var24._M_head_impl = (ExternType *)pRVar26[uVar39].index;
        local_378._0_8_ = _Var24._M_head_impl;
switchD_001b1b6a_default:
        iVar37._M_current =
             ((local_3d8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar37._M_current ==
            ((local_3d8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_3d8.obj_)->exports_,iVar37,(Ref *)local_378);
        }
        else {
          (iVar37._M_current)->index = (size_t)_Var24._M_head_impl;
          ((local_3d8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar37._M_current + 1;
        }
        pEVar42 = pEVar42 + 1;
      } while (pEVar42 != pEVar10);
    }
    pEVar41 = ((local_2f0.obj_)->desc_).elems.
              super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar11 = *(pointer *)
               ((long)&((local_2f0.obj_)->desc_).elems.
                       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
               + 8);
    if (pEVar41 != pEVar11) {
      do {
        local_378._0_8_ = pEVar41;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::Store&,wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_3d8.obj_)->elems_,store,(ElemDesc **)local_378,&local_3d8);
        pEVar41 = pEVar41 + 1;
      } while (pEVar41 != pEVar11);
    }
    pDVar43 = ((local_2f0.obj_)->desc_).datas.
              super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pDVar12 = *(pointer *)
               ((long)&((local_2f0.obj_)->desc_).datas.
                       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
               + 8);
    if (pDVar43 != pDVar12) {
      do {
        local_378._0_8_ = pDVar43;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_3d8.obj_)->datas_,(DataDesc **)local_378);
        pDVar43 = pDVar43 + 1;
      } while (pDVar43 != pDVar12);
    }
    bVar20 = (store->features_).bulk_memory_enabled_ == false;
    do {
      bVar19 = bVar20;
      pEVar13 = ((local_3d8.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_3d8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar13; src = src + 1) {
        pEVar14 = src->desc_;
        if (pEVar14->mode == Declared) {
          pRVar26 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar26) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar26;
          }
        }
        else if (pEVar14->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_3f8.v128_,store,
                     (Ref)((local_3d8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar14->table_index].index);
          local_2d8.i64_ = 0;
          local_2d8._8_8_ = 0;
          if (local_3d8.store_ == (Store *)0x0) {
            pMVar23 = (Memory *)0x0;
          }
          else {
            pMVar23 = (Memory *)
                      ((local_3d8.store_)->roots_).list_.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_3d8.root_index_].index;
            if ((long)pMVar23 < 0) goto LAB_001b25c9;
          }
          local_200.type.super_ExternType.kind = (pEVar14->init_func).type.super_ExternType.kind;
          local_200.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_200.type.params,&(pEVar14->init_func).type.params);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_200.type.results,&(pEVar14->init_func).type.results);
          std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                    (&local_200.locals,&(pEVar14->init_func).locals);
          local_200.code_offset = (pEVar14->init_func).code_offset;
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                    (&local_200.handlers,&(pEVar14->init_func).handlers);
          local_398._0_8_ = pMVar23;
          Store::
          Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                    ((RefPtr<wabt::interp::DefinedFunc> *)local_378,store,store,&local_398.ref_,
                     &local_200);
          if ((Store *)local_378._8_8_ == (Store *)0x0) {
            RVar31.index = 0;
          }
          else {
            RVar31.index = (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
            if ((long)RVar31.index < 0) goto LAB_001b25c9;
          }
          if ((long *)local_378._0_8_ != (long *)0x0) {
            Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
            local_378._0_8_ = (long *)0x0;
            local_378._8_8_ = (Store *)0x0;
            local_378._16_8_ = 0;
          }
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
          ~vector(&local_200.handlers);
          if (local_200.locals.
              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.locals.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_200.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_200.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          local_200.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
          if (local_200.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.type.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_200.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_200.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar38 = (Instance *)
                    local_200.type.params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((Instance *)
              local_200.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (Instance *)0x0) {
            operator_delete(local_200.type.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_200.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_200.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          store_00 = store;
          RVar22 = CallInitFunc(pIVar38,store,RVar31,(Value *)&local_2d8.v128_,local_380);
          if (RVar22.enum_ == Error) goto LAB_001b256b;
          uVar32 = local_2d8.i64_;
          if (*(bool *)(local_3f8.i64_ + 0x6a) == false) {
            uVar32 = (pointer)(local_2d8.i64_ & 0xffffffff);
          }
          if (bVar19) {
            uVar27 = (long)*(pointer *)(local_3f8.i64_ + 0x78) -
                     (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)
                            &((Buffer *)(local_3f8.i64_ + 0x70))->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->
                           _M_impl).super__Vector_impl_data._M_start >> 3;
            uVar39 = (ulong)((long)(src->elements_).
                                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(src->elements_).
                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
            RVar22.enum_ = (Enum)((pointer)(uVar27 - uVar39) <
                                  (pointer)(local_2d8.i64_ & 0xffffffff) || uVar27 < uVar39);
LAB_001b1f22:
            bVar20 = true;
            if (RVar22.enum_ == Error) {
              StringPrintf_abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,
                         "out of bounds table access: elem segment is out of bounds: [%lu, %lu) >= max value %u"
                         ,uVar32,(pointer)(uVar32 + ((ulong)((long)(src->elements_).
                                                                                                                                      
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(src->elements_).
                                                                                                                
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                                                  0xffffffff)),
                         (ulong)((long)(((Trap *)(local_3f8.i64_ + 0x78))->super_Object).
                                       _vptr_Object -
                                (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                         *)&((Buffer *)(local_3f8.i64_ + 0x70))->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )->_M_impl).super__Vector_impl_data._M_start) >> 3);
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              Store::
              Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                        ((RefPtr<wabt::interp::Trap> *)&local_398.v128_,store,store,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,&local_3b8);
              local_380->obj_ = (Trap *)local_398.i64_;
              local_380->store_ = (Store *)local_398._8_8_;
              local_380->root_index_ = local_388;
              local_388 = 0;
              local_398.i64_ = 0;
              local_398._8_8_ = (Store *)0x0;
              if (local_3b8.
                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3b8.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_3b8.
                                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_3b8.
                                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              local_3e0->obj_ = (Instance *)0x0;
              local_3e0->store_ = (Store *)0x0;
              local_3e0->root_index_ = 0;
              bVar20 = false;
            }
          }
          else {
            RVar22 = Table::Init((Table *)local_3f8.i64_,store_00,(u32)uVar32,src,0,
                                 (u32)((ulong)((long)(src->elements_).
                                                                                                          
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(src->elements_).
                                                                                                        
                                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
            if (RVar22.enum_ != Ok) goto LAB_001b1f22;
            pRVar26 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            bVar20 = true;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar26) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar26;
            }
          }
          if ((Memory *)local_3f8.i64_ != (Memory *)0x0) {
            Store::DeleteRoot((Store *)local_3f8._8_8_,local_3e8);
          }
          if (!bVar20) goto LAB_001b10d2;
        }
      }
      pDVar15 = ((local_3d8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((local_3d8.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar15;
          src_00 = src_00 + 1) {
        pDVar16 = src_00->desc_;
        if (pDVar16->mode == Declared) {
          src_00->size_ = 0;
        }
        else if (pDVar16->mode == Active) {
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_3f8.v128_,store,
                     (Ref)((local_3d8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar16->memory_index].index);
          local_2d8.i64_ = 0;
          local_2d8._8_8_ = 0;
          if (local_3d8.store_ == (Store *)0x0) {
            pMVar23 = (Memory *)0x0;
          }
          else {
            pMVar23 = (Memory *)
                      ((local_3d8.store_)->roots_).list_.
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_3d8.root_index_].index;
            if ((long)pMVar23 < 0) goto LAB_001b25c9;
          }
          local_278.type.super_ExternType.kind = (pDVar16->init_func).type.super_ExternType.kind;
          local_278.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_278.type.params,&(pDVar16->init_func).type.params);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    (&local_278.type.results,&(pDVar16->init_func).type.results);
          std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                    (&local_278.locals,&(pDVar16->init_func).locals);
          local_278.code_offset = (pDVar16->init_func).code_offset;
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
                    (&local_278.handlers,&(pDVar16->init_func).handlers);
          local_398._0_8_ = pMVar23;
          Store::
          Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                    ((RefPtr<wabt::interp::DefinedFunc> *)local_378,store,store,&local_398.ref_,
                     &local_278);
          if ((Store *)local_378._8_8_ == (Store *)0x0) {
            RVar31.index = 0;
          }
          else {
            RVar31.index = (((RootList *)(local_378._8_8_ + 0xb8))->list_).
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_378._16_8_].index;
            if ((long)RVar31.index < 0) goto LAB_001b25c9;
          }
          if ((long *)local_378._0_8_ != (long *)0x0) {
            Store::DeleteRoot((Store *)local_378._8_8_,local_378._16_8_);
            local_378._0_8_ = (long *)0x0;
            local_378._8_8_ = (Store *)0x0;
            local_378._16_8_ = 0;
          }
          std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
          ~vector(&local_278.handlers);
          if (local_278.locals.
              super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.locals.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.locals.
                                  super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          local_278.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_00246130;
          if (local_278.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.type.results.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_278.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.type.results.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar38 = (Instance *)
                    local_278.type.params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((Instance *)
              local_278.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start != (Instance *)0x0) {
            operator_delete(local_278.type.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_278.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.type.params.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          RVar22 = CallInitFunc(pIVar38,store,RVar31,(Value *)&local_2d8.v128_,local_380);
          if (RVar22.enum_ == Error) goto LAB_001b256b;
          uVar32 = (pointer)(local_2d8.i64_ & 0xffffffff);
          if (*(bool *)(local_3f8.i64_ + 0x62) != false) {
            uVar32 = local_2d8.i64_;
          }
          size = (pointer)src_00->size_;
          if (bVar19) {
            puVar25 = *(pointer *)(local_3f8.i64_ + 0x78) +
                      -(long)(((Buffer *)(local_3f8.i64_ + 0x70))->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
            RVar22.enum_ = (Enum)(puVar25 < (pointer)(uVar32 + (long)size) ||
                                 (puVar25 < size || puVar25 < (ulong)uVar32));
LAB_001b22b1:
            bVar20 = true;
            if (RVar22.enum_ == Error) {
              StringPrintf_abi_cxx11_
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,
                         "out of bounds memory access: data segment is out of bounds: [%lu, %lu) >= max value %lu"
                         ,uVar32,(pointer)(uVar32 + src_00->size_),
                         (long)(((Trap *)(local_3f8.i64_ + 0x78))->super_Object)._vptr_Object -
                         (long)(((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                  *)&((Buffer *)(local_3f8.i64_ + 0x70))->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                )->_M_impl).super__Vector_impl_data._M_start);
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_3b8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              Store::
              Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                        ((RefPtr<wabt::interp::Trap> *)&local_398.v128_,store,store,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,&local_3b8);
              local_380->obj_ = (Trap *)local_398.i64_;
              local_380->store_ = (Store *)local_398._8_8_;
              local_380->root_index_ = local_388;
              local_388 = 0;
              local_398.i64_ = 0;
              local_398._8_8_ = (Store *)0x0;
              if (local_3b8.
                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3b8.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_3b8.
                                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_3b8.
                                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
              }
              local_3e0->obj_ = (Instance *)0x0;
              local_3e0->store_ = (Store *)0x0;
              local_3e0->root_index_ = 0;
              bVar20 = false;
            }
          }
          else {
            RVar22 = Memory::Init((Memory *)local_3f8.i64_,uVar32,src_00,0,(u64)size);
            if (RVar22.enum_ != Ok) goto LAB_001b22b1;
            src_00->size_ = 0;
            bVar20 = true;
          }
          if ((Memory *)local_3f8.i64_ != (Memory *)0x0) {
            Store::DeleteRoot((Store *)local_3f8._8_8_,local_3e8);
          }
          if (!bVar20) goto LAB_001b10d2;
        }
      }
      bVar20 = false;
    } while (bVar19);
    pSVar33 = ((local_2f0.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar17 = *(pointer *)
               ((long)&((local_2f0.obj_)->desc_).starts.
                       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>
               + 8);
    if (pSVar33 != pSVar17) {
      do {
        RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)&local_3f8.v128_,store,
                   (Ref)((local_3d8.obj_)->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[pSVar33->func_index].index);
        uVar32 = local_3f8.i64_;
        local_388 = 0;
        local_398.i64_ = 0;
        local_398._8_8_ = (Store *)0x0;
        local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Thread::Thread((Thread *)local_378,store,(Stream *)0x0);
        iVar21 = (**(code **)(*(long *)uVar32 + 0x28))
                           (uVar32,(Thread *)local_378,&local_3b8,&local_398,local_380);
        Thread::~Thread((Thread *)local_378);
        if (local_3b8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3b8.
                          super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_3b8.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3b8.
                                super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar21 == 1) {
          local_3e0->obj_ = (Instance *)0x0;
          local_3e0->store_ = (Store *)0x0;
          local_3e0->root_index_ = 0;
          if ((Memory *)local_398.i64_ != (Memory *)0x0) {
            operator_delete((void *)local_398.i64_,local_388 - local_398._0_8_);
          }
          goto LAB_001b257e;
        }
        if ((Memory *)local_398.i64_ != (Memory *)0x0) {
          operator_delete((void *)local_398.i64_,local_388 - local_398._0_8_);
        }
        if ((Memory *)local_3f8.i64_ != (Memory *)0x0) {
          Store::DeleteRoot((Store *)local_3f8._8_8_,local_3e8);
        }
        pSVar33 = pSVar33 + 1;
      } while (pSVar33 != pSVar17);
    }
    local_3e0->obj_ = local_3d8.obj_;
    local_3e0->store_ = local_3d8.store_;
    local_3e0->root_index_ = local_3d8.root_index_;
    goto LAB_001b10e9;
  }
  local_378._0_8_ = local_378 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"not enough imports!","");
  local_388 = 0;
  local_398.i64_ = 0;
  local_398._8_8_ = (Store *)0x0;
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            ((RefPtr<wabt::interp::Trap> *)&local_3f8.v128_,store,store,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
             (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_398.v128_);
  out_trap->obj_ = (Trap *)local_3f8.i64_;
  out_trap->store_ = (Store *)local_3f8._8_8_;
  out_trap->root_index_ = local_3e8;
  local_3e8 = 0;
  local_3f8.i64_ = 0;
  local_3f8._8_8_ = (Store *)0x0;
  if ((Memory *)local_398.i64_ != (Memory *)0x0) {
    operator_delete((void *)local_398.i64_,local_388 - local_398._0_8_);
  }
LAB_001b10aa:
  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
    operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
  }
LAB_001b10bf:
  local_3e0->obj_ = (Instance *)0x0;
  local_3e0->store_ = (Store *)0x0;
  local_3e0->root_index_ = 0;
  goto LAB_001b10d2;
LAB_001b256b:
  local_3e0->obj_ = (Instance *)0x0;
  local_3e0->store_ = (Store *)0x0;
  local_3e0->root_index_ = 0;
LAB_001b257e:
  if ((Memory *)local_3f8.i64_ != (Memory *)0x0) {
    Store::DeleteRoot((Store *)local_3f8._8_8_,local_3e8);
  }
LAB_001b10d2:
  if (local_3d8.obj_ != (Instance *)0x0) {
    Store::DeleteRoot(local_3d8.store_,local_3d8.root_index_);
  }
LAB_001b10e9:
  if (local_2f0.obj_ != (Module *)0x0) {
    Store::DeleteRoot(local_2f0.store_,local_2f0.root_index_);
  }
  return local_3e0;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Tag:    inst->tags_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
      return {};
    }
    inst->globals_.push_back(Global::New(store, desc.type, value).ref());
  }

  // Tags.
  for (auto&& desc : mod->desc().tags) {
    inst->tags_.push_back(Tag::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports) {
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Tag:    ref = inst->tags_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(store, &desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  // The MVP requires that all segments are bounds-checked before being copied
  // into the table or memory. The bulk memory proposal changes this behavior;
  // instead, each segment is copied in order. If any segment fails, then no
  // further segments are copied. Any data that was written persists.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        Value value;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
          return {};
        }

        u64 offset;
        if (table->type().limits.is_64) {
          offset = value.Get<u64>();
        } else {
          offset = value.Get<u32>();
        }

        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds table access: elem segment is "
                           "out of bounds: [%" PRIu64 ", %" PRIu64
                           ") >= max value %u",
                           offset, offset + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        Value offset_op;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &offset_op, out_trap))) {
          return {};
        }
        u64 offset = memory->type().limits.is_64 ? offset_op.Get<u64>()
                                                 : offset_op.Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds memory access: data segment is "
                         "out of bounds: [%" PRIu64 ", %" PRIu64
                         ") >= max value %" PRIu64,
                         offset, offset + segment.size(), memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}